

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_printer.c
# Opt level: O0

void flatcc_json_printer_indent(flatcc_json_printer_t *ctx)

{
  flatcc_json_printer_t *ctx_local;
  
  print_indent(ctx);
  return;
}

Assistant:

void flatcc_json_printer_indent(flatcc_json_printer_t *ctx)
{
    /*
     * This is only needed when indent is 0 but helps external users
     * to avoid flushing when indenting.
     */
    print_indent(ctx);
}